

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

void __thiscall CEPlanet::UpdatePosition(CEPlanet *this,double *jd)

{
  double *in_RSI;
  long *in_RDI;
  
  if ((-1e+29 < *in_RSI || *in_RSI == -1e+29) &&
     ((*in_RSI != (double)in_RDI[0x10] || (NAN(*in_RSI) || NAN((double)in_RDI[0x10]))))) {
    if ((int)in_RDI[0xe] == 1) {
      (**(code **)(*in_RDI + 0x78))(*in_RSI);
    }
    else if ((int)in_RDI[0xe] == 0) {
      (**(code **)(*in_RDI + 0x80))(*in_RSI);
    }
  }
  return;
}

Assistant:

void CEPlanet::UpdatePosition(const double& jd) const
{
    // If no date was supplied, or if the date hasnt changed, do nothing
    if ((jd < -1.0e29) || (jd == cached_jd_)) {
        return ;
    } else if (algorithm_type_ == CEPlanetAlgo::JPL) {
        Update_JPL(jd) ;
    } else if (algorithm_type_ == CEPlanetAlgo::SOFA) {
        Update_SOFA(jd) ;
    }
}